

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte bVar1;
  uint32_t v;
  undefined4 uVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 local_19;
  
  pvVar3 = lj_mem_realloc(L,*ud,*(MSize *)((long)ud + 0xc),0x400);
  *(void **)ud = pvVar3;
  *(undefined4 *)((long)ud + 0xc) = 0x400;
  uVar5 = (ulong)*(uint *)(*(long *)((long)ud + 0x18) + 0x28);
  v = *(uint32_t *)(uVar5 + 0xc);
  *(undefined4 *)((long)ud + 8) = 0;
  if (v + 10 < 0x401) {
    uVar4 = 0;
  }
  else {
    bcwrite_resize((BCWriteCtx *)ud,v + 10);
    uVar4 = *(uint *)((long)ud + 8);
    pvVar3 = *ud;
  }
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)((long)pvVar3 + (ulong)uVar4) = 0x1b;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 0x4c;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 0x4a;
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(undefined1 *)(*ud + (ulong)uVar4) = 1;
  bVar1 = *(byte *)(*(long *)((long)ud + 0x18) + 0x25);
  uVar4 = *(uint *)((long)ud + 8);
  *(uint *)((long)ud + 8) = uVar4 + 1;
  *(byte *)(*ud + (ulong)uVar4) = bVar1 & 4 | (*(int *)((long)ud + 0x30) != 0) * '\x02';
  if (*(int *)((long)ud + 0x30) == 0) {
    bcwrite_uleb128((BCWriteCtx *)ud,v);
    bcwrite_block((BCWriteCtx *)ud,(void *)(uVar5 + 0x10),v);
  }
  uVar2 = (**(code **)((long)ud + 0x20))
                    (*(undefined8 *)((long)ud + 0x10),*ud,*(undefined4 *)((long)ud + 8),
                     *(undefined8 *)((long)ud + 0x28));
  *(undefined4 *)((long)ud + 0x34) = uVar2;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x18));
  if (*(int *)((long)ud + 0x34) == 0) {
    local_19 = 0;
    uVar2 = (**(code **)((long)ud + 0x20))
                      (*(undefined8 *)((long)ud + 0x10),&local_19,1,*(undefined8 *)((long)ud + 0x28)
                      );
    *(undefined4 *)((long)ud + 0x34) = uVar2;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(dummy);
  lj_str_resizebuf(L, &ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}